

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeAtomicCmpxchg<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,uint8_t bytes)

{
  Memarg *pMVar1;
  Memarg *mem_00;
  undefined1 local_e0 [8];
  MaybeResult<wasm::Name> mem;
  undefined1 local_98 [8];
  Result<wasm::WATParser::Memarg> _val_1;
  undefined1 auStack_60 [8];
  Result<wasm::WATParser::Memarg> arg;
  
  _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = type.id;
  arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._36_4_ = pos;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_e0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_60,
                  (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e0);
  if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string((string *)local_98,(string *)auStack_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_60);
    memarg<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::Memarg> *)auStack_60,ctx,(uint)bytes);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)local_98,
                    (_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)auStack_60);
    if (_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),
                 (string *)local_98);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)local_98);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)local_98);
      mem_00 = (Memarg *)local_e0;
      if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
        mem_00 = (Memarg *)0x0;
      }
      pMVar1 = (Memarg *)auStack_60;
      if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ != '\0') {
        pMVar1 = (Memarg *)0x0;
      }
      ParseDefsCtx::makeAtomicCmpxchg
                (__return_storage_ptr__,ctx,
                 arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._36_4_,annotations
                 ,(Type)_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_,
                 (uint)bytes,(Name *)mem_00,*pMVar1);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)auStack_60);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations,
                           Type type,
                           uint8_t bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeAtomicCmpxchg(
    pos, annotations, type, bytes, mem.getPtr(), *arg);
}